

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall
Js::CompoundString::CompoundString(CompoundString *this,CompoundString *other,bool forAppending)

{
  code *pcVar1;
  bool bVar2;
  charcount_t newLength;
  JavascriptLibrary *this_00;
  StaticType *type;
  undefined4 *puVar3;
  Type TVar4;
  bool ownsLastBlock;
  bool forAppending_local;
  CompoundString *other_local;
  CompoundString *this_local;
  
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)other);
  type = JavascriptLibrary::GetStringTypeStatic(this_00);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfc9b0;
  BlockInfo::BlockInfo(&this->lastBlockInfo,&other->lastBlockInfo);
  this->directCharLength = other->directCharLength;
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierPtr
            (&this->lastBlock,&other->lastBlock);
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)other);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1fa,"(!other.IsFinalized())","!other.IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  newLength = JavascriptString::GetLength((JavascriptString *)other);
  JavascriptString::SetLength((JavascriptString *)this,newLength);
  if (forAppending) {
    TVar4 = (Type)(other->ownsLastBlock & 1);
    other->ownsLastBlock = false;
    this->ownsLastBlock = TVar4;
    if (TVar4 == false) {
      TakeOwnershipOfLastBlock(this);
    }
  }
  else {
    this->ownsLastBlock = false;
  }
  return;
}

Assistant:

CompoundString::CompoundString(CompoundString &other, const bool forAppending)
        : LiteralString(other.GetLibrary()->GetStringTypeStatic()),
        lastBlockInfo(other.lastBlockInfo),
        directCharLength(other.directCharLength),
        lastBlock(other.lastBlock)
    {
        Assert(!other.IsFinalized());

        SetLength(other.GetLength());

        if(forAppending)
        {
            // This compound string will be used for appending, so take ownership of the last block. Appends are fast for a
            // compound string that owns the last block.
            const bool ownsLastBlock = other.ownsLastBlock;
            other.ownsLastBlock = false;
            this->ownsLastBlock = ownsLastBlock;
            if(ownsLastBlock)
                return;
            TakeOwnershipOfLastBlock();
            return;
        }

        ownsLastBlock = false;
    }